

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

GCstr * argv2str(jit_State *J,TValue *o)

{
  GCstr *s;
  TValue *o_local;
  jit_State *J_local;
  
  if ((int)(o->field_4).it >> 0xf == -5) {
    J_local = (jit_State *)(o->u64 & 0x7fffffffffff);
  }
  else {
    if (0xfffffff2 < (uint)((int)(o->field_4).it >> 0xf)) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    J_local = (jit_State *)lj_strfmt_number(J->L,o);
    o->u64 = (ulong)J_local | 0xfffd800000000000;
  }
  return (GCstr *)J_local;
}

Assistant:

static GCstr *argv2str(jit_State *J, TValue *o)
{
  if (LJ_LIKELY(tvisstr(o))) {
    return strV(o);
  } else {
    GCstr *s;
    if (!tvisnumber(o))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    s = lj_strfmt_number(J->L, o);
    setstrV(J->L, o, s);
    return s;
  }
}